

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2_ref.c
# Opt level: O1

void randomx_argon2_fill_segment_ref(argon2_instance_t *instance,argon2_position_t position)

{
  uint uVar1;
  ulong uVar2;
  block *pbVar3;
  uint32_t uVar4;
  uint uVar5;
  int with_xor;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  argon2_position_t local_48;
  ulong local_38;
  
  if (instance != (argon2_instance_t *)0x0) {
    local_48.pass = position.pass;
    local_48.slice = position.slice;
    uVar7 = (uint)(local_48.slice == 0 && local_48.pass == 0) * 2;
    if (uVar7 < instance->segment_length) {
      uVar1 = instance->lane_length;
      local_48.lane = position.lane;
      uVar5 = (uint)local_48.slice * instance->segment_length + local_48.lane * uVar1;
      local_38 = (ulong)uVar5;
      uVar5 = uVar5 + uVar7;
      uVar5 = (-(uint)(uVar5 % uVar1 != 0) | uVar1 - 1) + uVar5;
      local_48._0_8_ = position._0_8_;
      local_48._8_8_ = position._8_8_;
      do {
        uVar9 = (int)local_38 + uVar7;
        uVar1 = (int)local_38 + -1 + uVar7;
        if (uVar9 % instance->lane_length != 1) {
          uVar1 = uVar5;
        }
        uVar2 = instance->memory[uVar1].v[0];
        uVar6 = (uVar2 >> 0x20) % (ulong)instance->lanes;
        uVar8 = uVar6;
        if (local_48.slice == '\0') {
          uVar8 = (ulong)local_48._0_8_ >> 0x20;
        }
        if (local_48.pass != 0) {
          uVar8 = uVar6;
        }
        local_48.index = uVar7;
        uVar4 = randomx_argon2_index_alpha
                          (instance,&local_48,(uint32_t)uVar2,
                           (uint)(uVar8 == (ulong)local_48._0_8_ >> 0x20));
        pbVar3 = instance->memory;
        if ((instance->version == 0x10) || (local_48.pass == 0)) {
          with_xor = 0;
        }
        else {
          with_xor = 1;
        }
        fill_block(pbVar3 + uVar1,pbVar3 + instance->lane_length * uVar8 + (ulong)uVar4,
                   pbVar3 + uVar9,with_xor);
        uVar7 = uVar7 + 1;
        uVar5 = uVar1 + 1;
      } while (uVar7 < instance->segment_length);
    }
  }
  return;
}

Assistant:

void randomx_argon2_fill_segment_ref(const argon2_instance_t *instance,
	argon2_position_t position) {
	block *ref_block = NULL, *curr_block = NULL;
	block address_block, input_block, zero_block;
	uint64_t pseudo_rand, ref_index, ref_lane;
	uint32_t prev_offset, curr_offset;
	uint32_t starting_index;
	uint32_t i;

	if (instance == NULL) {
		return;
	}

	starting_index = 0;

	if ((0 == position.pass) && (0 == position.slice)) {
		starting_index = 2; /* we have already generated the first two blocks */
	}

	/* Offset of the current block */
	curr_offset = position.lane * instance->lane_length +
		position.slice * instance->segment_length + starting_index;

	if (0 == curr_offset % instance->lane_length) {
		/* Last block in this lane */
		prev_offset = curr_offset + instance->lane_length - 1;
	}
	else {
		/* Previous block */
		prev_offset = curr_offset - 1;
	}

	for (i = starting_index; i < instance->segment_length;
		++i, ++curr_offset, ++prev_offset) {
		/*1.1 Rotating prev_offset if needed */
		if (curr_offset % instance->lane_length == 1) {
			prev_offset = curr_offset - 1;
		}

		/* 1.2 Computing the index of the reference block */
		/* 1.2.1 Taking pseudo-random value from the previous block */
		pseudo_rand = instance->memory[prev_offset].v[0];

		/* 1.2.2 Computing the lane of the reference block */
		ref_lane = ((pseudo_rand >> 32)) % instance->lanes;

		if ((position.pass == 0) && (position.slice == 0)) {
			/* Can not reference other lanes yet */
			ref_lane = position.lane;
		}

		/* 1.2.3 Computing the number of possible reference block within the
		 * lane.
		 */
		position.index = i;
		ref_index = randomx_argon2_index_alpha(instance, &position, pseudo_rand & 0xFFFFFFFF,
			ref_lane == position.lane);

		/* 2 Creating a new block */
		ref_block =
			instance->memory + instance->lane_length * ref_lane + ref_index;
		curr_block = instance->memory + curr_offset;
		if (ARGON2_VERSION_10 == instance->version) {
			/* version 1.2.1 and earlier: overwrite, not XOR */
			fill_block(instance->memory + prev_offset, ref_block, curr_block, 0);
		}
		else {
			if (0 == position.pass) {
				fill_block(instance->memory + prev_offset, ref_block,
					curr_block, 0);
			}
			else {
				fill_block(instance->memory + prev_offset, ref_block,
					curr_block, 1);
			}
		}
	}
}